

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O2

void __thiscall Memory::Recycler::CleanupPendingUnroot(Recycler *this)

{
  DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount> *pDVar1;
  EntryType *current;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  undefined4 *puVar6;
  GuestArenaAllocator *pGVar7;
  ulong uVar8;
  SimpleHashEntry<void_*,_Memory::Recycler::PinRecord> **ppSVar9;
  undefined1 local_40 [8];
  EditingIterator guestArenaIter;
  
  if (this->hasPendingConcurrentFindRoot == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x1365,"(!this->hasPendingConcurrentFindRoot)",
                       "!this->hasPendingConcurrentFindRoot");
    if (!bVar3) goto LAB_0067f93b;
    *puVar6 = 0;
  }
  if (this->hasPendingUnpinnedObject == true) {
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    for (uVar8 = 0; uVar8 < (this->pinnedObjectMap).size; uVar8 = uVar8 + 1) {
      ppSVar9 = (this->pinnedObjectMap).table + uVar8;
      while (current = *ppSVar9, current != (EntryType *)0x0) {
        uVar5 = (current->value).refCount;
        if ((uVar5 == 0) && ((current->value).stackBackTraces != (StackBackTraceNode *)0x0)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar6 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                             ,0x136c,"(refCount != 0 || refCount.stackBackTraces == nullptr)",
                             "refCount != 0 || refCount.stackBackTraces == nullptr");
          if (!bVar3) goto LAB_0067f93b;
          *puVar6 = 0;
          uVar5 = (current->value).refCount;
        }
        if (uVar5 == 0) {
          *ppSVar9 = current->next;
          SimpleHashTable<void_*,_Memory::Recycler::PinRecord,_Memory::HeapAllocator,_DefaultComparer,_true,_PrimePolicy>
          ::FreeEntry(&this->pinnedObjectMap,current);
        }
        else {
          ppSVar9 = &current->next;
        }
      }
    }
    this->hasPendingUnpinnedObject = false;
  }
  pDVar1 = &this->guestArenaList;
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  local_40 = (undefined1  [8])pDVar1;
  guestArenaIter.super_Iterator.list = pDVar1;
  if (this->hasPendingDeleteGuestArena == true) {
    bVar3 = false;
    while( true ) {
      if (guestArenaIter.super_Iterator.list ==
          (DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                           ,0x66,"(current != nullptr)","current != nullptr");
        if (!bVar4) goto LAB_0067f93b;
        *puVar6 = 0;
      }
      guestArenaIter.super_Iterator.list =
           ((guestArenaIter.super_Iterator.list)->
           super_DListNodeBase<Memory::Recycler::GuestArenaAllocator>).next.list;
      if ((undefined1  [8])guestArenaIter.super_Iterator.list == local_40) break;
      pGVar7 = DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount>::Iterator::Data
                         ((Iterator *)local_40);
      if (pGVar7->pendingDelete == true) {
        (pGVar7->super_ArenaAllocator).
        super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.super_ArenaData.
        lockBlockList = false;
        DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount>::EditingIterator::
        RemoveCurrent<Memory::HeapAllocator>((EditingIterator *)local_40,&HeapAllocator::Instance);
        bVar3 = true;
      }
    }
    guestArenaIter.super_Iterator.list =
         (DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount> *)0x0;
    this->hasPendingDeleteGuestArena = false;
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x1383,"(foundPendingDelete)","foundPendingDelete");
      if (!bVar3) {
LAB_0067f93b:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar6 = 0;
    }
  }
  else {
    while( true ) {
      if (guestArenaIter.super_Iterator.list ==
          (DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                           ,0x66,"(current != nullptr)","current != nullptr");
        if (!bVar3) goto LAB_0067f93b;
        *puVar6 = 0;
      }
      guestArenaIter.super_Iterator.list =
           ((guestArenaIter.super_Iterator.list)->
           super_DListNodeBase<Memory::Recycler::GuestArenaAllocator>).next.list;
      if ((undefined1  [8])guestArenaIter.super_Iterator.list == local_40) break;
      pGVar7 = DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount>::Iterator::Data
                         ((Iterator *)local_40);
      if (pGVar7->pendingDelete == true) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                           ,0x138c,"(!allocator.pendingDelete)","!allocator.pendingDelete");
        if (!bVar3) goto LAB_0067f93b;
        *puVar6 = 0;
      }
    }
  }
  return;
}

Assistant:

void
Recycler::CleanupPendingUnroot()
{
    Assert(!this->hasPendingConcurrentFindRoot);
    if (hasPendingUnpinnedObject)
    {
        pinnedObjectMap.MapAndRemoveIf([](void * obj, PinRecord const &refCount)
        {
#if defined(CHECK_MEMORY_LEAK) || defined(LEAK_REPORT)
#ifdef STACK_BACK_TRACE
            Assert(refCount != 0 || refCount.stackBackTraces == nullptr);
#endif
#endif
            return refCount == 0;
        });
        hasPendingUnpinnedObject = false;
    }

    if (hasPendingDeleteGuestArena)
    {
        DebugOnly(bool foundPendingDelete = false);
        DListBase<GuestArenaAllocator>::EditingIterator guestArenaIter(&guestArenaList);
        while (guestArenaIter.Next())
        {
            GuestArenaAllocator& allocator = guestArenaIter.Data();
            if (allocator.pendingDelete)
            {
                allocator.SetLockBlockList(false);
                guestArenaIter.RemoveCurrent(&HeapAllocator::Instance);
                DebugOnly(foundPendingDelete = true);
            }
        }
        hasPendingDeleteGuestArena = false;
        Assert(foundPendingDelete);
    }
#if DBG
    else
    {
        DListBase<GuestArenaAllocator>::Iterator guestArenaIter(&guestArenaList);
        while (guestArenaIter.Next())
        {
            GuestArenaAllocator& allocator = guestArenaIter.Data();
            Assert(!allocator.pendingDelete);
        }
    }
#endif
}